

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
 __thiscall
wabt::MakeUnique<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Location&>(wabt *this,Location *args)

{
  BlockExprBase<(wabt::ExprType)26> *this_00;
  Location *args_local;
  
  this_00 = (BlockExprBase<(wabt::ExprType)26> *)operator_new(0x118);
  BlockExprBase<(wabt::ExprType)26>::BlockExprBase(this_00,args);
  std::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>>
  ::unique_ptr<std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>,void>
            ((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>,_true,_true>
          )(__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}